

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

uint8_t * __thiscall
Lodtalk::GarbageCollector::allocateObjectMemory
          (GarbageCollector *this,size_t objectSize,bool bigObject)

{
  VMHeap *this_00;
  ulong *puVar1;
  ulong uVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->controlMutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (7 < objectSize) {
    this_00 = this->memoryManager->heap;
    if (this_00->size <= (this_00->capacity << 2) / 5) {
      this->garbageCollectionQueued = true;
    }
    uVar2 = (ulong)bigObject;
    puVar1 = (ulong *)VMHeap::allocate(this_00,objectSize + uVar2 * 8 + 8);
    *puVar1 = uVar2;
    puVar1[uVar2 + 1] = 0;
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    return (uint8_t *)(puVar1 + uVar2 + 1);
  }
  __assert_fail("objectSize >= sizeof(ObjectHeader)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MemoryManager.cpp"
                ,0x13a,"uint8_t *Lodtalk::GarbageCollector::allocateObjectMemory(size_t, bool)");
}

Assistant:

uint8_t *GarbageCollector::allocateObjectMemory(size_t objectSize, bool bigObject)
{
    std::unique_lock<std::mutex> l(controlMutex);

    auto heap = memoryManager->getHeap();
	assert(objectSize >= sizeof(ObjectHeader));
    // Should I enqueue a garbage collection?
    if (!heap->hasCapacityThresholdBeenReached())
        queueGarbageCollection();

    // Add a forwarding slot, used by compaction.
    auto extraHeaderSize = 8;
    if(bigObject)
        extraHeaderSize += 8;

	// Allocate from the VM heap.
    auto result = memoryManager->getHeap()->allocate(objectSize + extraHeaderSize);
    auto allocatedObjectHeader = reinterpret_cast<AllocatedObject*> (result);
    allocatedObjectHeader->rawForwardingPointer = bigObject ? 1 : 0;
    result += extraHeaderSize;

	auto header = reinterpret_cast<ObjectHeader*> (result);
	*header = {0};

	return result;
}